

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::RandomNumberUtil::GetRandomBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,int len)

{
  int iVar1;
  uint uVar2;
  result_type_conflict rVar3;
  long lVar4;
  allocator_type local_2d;
  uint32_t random;
  
  if ((GetRandomBytes(int)::rd == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetRandomBytes(int)::rd), iVar1 != 0)) {
    std::random_device::random_device(&GetRandomBytes::rd);
    __cxa_atexit(std::random_device::~random_device,&GetRandomBytes::rd,&__dso_handle);
    __cxa_guard_release(&GetRandomBytes(int)::rd);
  }
  if ((GetRandomBytes(int)::engine == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetRandomBytes(int)::engine), iVar1 != 0)) {
    uVar2 = ::std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&GetRandomBytes::engine,(ulong)uVar2);
    __cxa_guard_release(&GetRandomBytes(int)::engine);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)len,&local_2d);
  lVar4 = 0;
  iVar1 = len / 4;
  if (len / 4 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != (int)lVar4; lVar4 = lVar4 + 1) {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&GetRandomBytes::engine);
    *(int *)((__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + lVar4 * 4) = (int)rVar3;
  }
  if (len % 4 != 0) {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&GetRandomBytes::engine);
    random = (uint32_t)rVar3;
    memcpy((__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + lVar4 * 4,&random,(long)(len % 4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> RandomNumberUtil::GetRandomBytes(int len) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  std::vector<uint8_t> result(len);

  int index = 0;
  for (int i = 0; i < len / 4; i++) {
    uint32_t random = engine();
    memcpy(&result[index], reinterpret_cast<uint8_t *>(&random), 4);
    index += 4;
  }

  int remainder = len % 4;
  if (remainder != 0) {
    uint32_t random = engine();
    memcpy(&result[index], reinterpret_cast<uint8_t *>(&random), remainder);
  }

  return result;
}